

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::InputFile::Data::fillBuffer
          (Data *this,ConstIterator to,int scanline1,int scanline2,int yStart,int xStart,int width)

{
  double dVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ushort uVar8;
  char cVar9;
  ArgExc *this_00;
  ushort uVar10;
  ushort uVar11;
  int iVar12;
  long lVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  float *pfVar17;
  long lVar18;
  uint32_t ui;
  float fVar19;
  imath_half_bits_t ret;
  ushort uVar20;
  uint fill;
  float fill_1;
  float fVar21;
  
  if ((*(int *)((long)to._i._M_node + 0x140) == 1) && (*(int *)((long)to._i._M_node + 0x144) == 1))
  {
    if (scanline1 <= scanline2) {
      lVar4 = *(long *)((long)to._i._M_node + 0x130);
      dVar1 = *(double *)((long)to._i._M_node + 0x148);
      lVar18 = 0;
      if ((*(byte *)((long)to._i._M_node + 0x150) & 1) == 0) {
        lVar18 = xStart * lVar4;
      }
      lVar5 = *(long *)((long)to._i._M_node + 0x128);
      fVar21 = (float)dVar1;
      fVar19 = ABS(fVar21);
      uVar16 = (uint)fVar21 & 0x7fffff | 0x800000;
      cVar9 = (char)((uint)fVar21 >> 0x17);
      uVar20 = (ushort)((uint)fVar21 >> 0x10) & 0x8000;
      uVar15 = (uint)fVar21 >> 0xd & 0x3ff;
      uVar14 = uVar20 + 0x7c00;
      if ((uint)fVar19 < 0x477ff000) {
        uVar14 = (ushort)((int)fVar19 + 0x8000fff + (uint)(((uint)fVar19 >> 0xd & 1) != 0) >> 0xd) |
                 uVar20;
      }
      iVar3 = *(int *)((long)to._i._M_node + 0x120);
      bVar2 = *(byte *)((long)to._i._M_node + 0x151);
      lVar6 = *(long *)((long)to._i._M_node + 0x138);
      uVar10 = (ushort)(uVar15 == 0) | (ushort)uVar15;
      if (fVar19 == INFINITY) {
        uVar10 = 0;
      }
      lVar13 = (long)scanline1;
      do {
        lVar7 = lVar13;
        if ((bVar2 & 1) != 0) {
          lVar7 = lVar13 - yStart;
        }
        pfVar17 = (float *)(lVar7 * lVar6 + lVar18 + lVar5);
        if (iVar3 == 2) {
          iVar12 = width;
          if (0 < width) {
            do {
              *pfVar17 = fVar21;
              pfVar17 = (float *)((long)pfVar17 + lVar4);
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
        }
        else if (iVar3 == 1) {
          uVar8 = uVar14;
          if (0x7f7fffff < (uint)fVar19) {
            uVar8 = uVar10 + uVar20 + 0x7c00;
          }
          uVar11 = (ushort)(0x80000000 < uVar16 << (cVar9 + 0xa2U & 0x1f)) +
                   ((ushort)(uVar16 >> (0x7eU - cVar9 & 0x1f)) | uVar20);
          if ((uint)fVar19 < 0x33000001) {
            uVar11 = uVar20;
          }
          if (0x387fffff < (uint)fVar19) {
            uVar11 = uVar8;
          }
          iVar12 = width;
          if (0 < width) {
            do {
              *(ushort *)pfVar17 = uVar11;
              pfVar17 = (float *)((long)pfVar17 + lVar4);
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
        }
        else if ((iVar3 == 0) && (iVar12 = width, 0 < width)) {
          do {
            *pfVar17 = (float)(long)dVar1;
            pfVar17 = (float *)((long)pfVar17 + lVar4);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        lVar13 = lVar13 + 1;
      } while (scanline2 + 1 != (int)lVar13);
    }
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
InputFile::Data::fillBuffer (FrameBuffer::ConstIterator to,
                             int scanline1, int scanline2,
                             int yStart, int xStart, int width)
{
    Slice toSlice = to.slice ();
    if (toSlice.xSampling != 1 || toSlice.ySampling != 1)
        throw IEX_NAMESPACE::ArgExc ("Tiled data should not have subsampling.");

    for (int y = scanline1; y <= scanline2; ++y)
    {
        char* toPtr = toSlice.base;

        if (toSlice.yTileCoords)
            toPtr += ( int64_t (y) - int64_t (yStart) ) * toSlice.yStride;
        else
            toPtr += int64_t (y) * toSlice.yStride;
        if (!toSlice.xTileCoords)
            toPtr += int64_t (xStart) * toSlice.xStride;

        //
        // Copy all pixels for the scanline in this row of tiles
        //

        switch (toSlice.type)
        {
            case UINT:
            {
                unsigned int fill =
                    static_cast<unsigned int> (toSlice.fillValue);
                for (int x = 0; x < width; ++x)
                {
                    *reinterpret_cast<unsigned int*> (toPtr) = fill;
                    toPtr += toSlice.xStride;
                }
                break;
            }
            case HALF:
            {
                half fill = toSlice.fillValue;
                for (int x = 0; x < width; ++x)
                {
                    *reinterpret_cast<half*> (toPtr) = fill;
                    toPtr += toSlice.xStride;
                }
                break;
            }
            case FLOAT:
            {
                float fill = toSlice.fillValue;
                for (int x = 0; x < width; ++x)
                {
                    *reinterpret_cast<float*> (toPtr) = fill;
                    toPtr += toSlice.xStride;
                }
                break;
            }
            case NUM_PIXELTYPES:
                break;
        }
    }
}